

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O2

clock_t experiment::forwardExperiment(uint cashSize)

{
  clock_t cVar1;
  clock_t cVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = (ulong)(cashSize << 8);
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    rand();
  }
  cVar1 = clock();
  cVar2 = clock();
  return cVar2 - cVar1;
}

Assistant:

clock_t experiment::forwardExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA=0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
       for(unsigned int j = 0; j < cashSize * 256; ++j)
       {
           newA = a[j];
       }
    }
    finish = clock();
    a[0]=newA;
    delete[]a;
    return finish - start;
}